

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_lam(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  uint32_t local_34;
  int i;
  uintptr_t ra;
  uint64_t uStack_20;
  uint32_t r3_local;
  uint64_t a2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  local_34 = r1;
  uStack_20 = a2;
  if ((a2 & 3) == 0) {
    while( true ) {
      uVar1 = cpu_ldl_data_ra_s390x(env,uStack_20,unaff_retaddr);
      env->aregs[(int)local_34] = uVar1;
      uStack_20 = uStack_20 + 4;
      if (local_34 == r3) break;
      local_34 = (int)(local_34 + 1) % 0x10;
    }
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(lam)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    int i;

    if (a2 & 0x3) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        env->aregs[i] = cpu_ldl_data_ra(env, a2, ra);
        a2 += 4;

        if (i == r3) {
            break;
        }
    }
}